

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void DumpGraph(VmModule *module)

{
  InstructionVMGraphContext instGraphCtx;
  OutputContext outputCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  InstructionVMGraphContext local_2298;
  OutputContext local_2268;
  char local_2028 [4096];
  char local_1028 [4096];
  
  local_2268.stream = (void *)0x0;
  local_2268.openStream = OutputContext::FileOpen;
  local_2268.writeStream = OutputContext::FileWrite;
  local_2268.closeStream = OutputContext::FileClose;
  local_2268.outputBufSize = 0x1000;
  local_2268.outputBufPos = 0;
  local_2268.outputBuf = local_1028;
  local_2268.tempBuf = local_2028;
  local_2268.tempBufSize = 0x1000;
  local_2268.stream = fopen("inst_graph.txt","w");
  local_2268.writeStream = OutputContext::FileWrite;
  local_2298.code = (char *)0x0;
  local_2298.depth = 0;
  local_2298.lastStart = (char *)0x0;
  local_2298.lastStartOffset = 0;
  local_2298.lastEndOffset = 0;
  local_2298.showContainers = true;
  local_2298.displayAsTree = false;
  local_2298.showTypes = true;
  local_2298.showFullTypes = true;
  local_2298.showUsers = true;
  local_2298.showComments = true;
  local_2298.showSource = true;
  local_2298.showAnnotatedSource = false;
  local_2298.output = &local_2268;
  PrintGraph(&local_2298,module);
  fclose((FILE *)local_2268.stream);
  local_2268.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_2268);
  return;
}

Assistant:

void DumpGraph(VmModule *module)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionVMGraphContext instGraphCtx(outputCtx);

	instGraphCtx.showUsers = true;
	instGraphCtx.displayAsTree = false;
	instGraphCtx.showFullTypes = true;
	instGraphCtx.showSource = true;

	PrintGraph(instGraphCtx, module);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}